

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall
QGraphicsItem::collidesWithPath(QGraphicsItem *this,QPainterPath *path,ItemSelectionMode mode)

{
  ulong uVar1;
  qreal qVar2;
  char cVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QPainterPath thisShape;
  undefined1 local_78 [8];
  QRectF local_70;
  double dStack_50;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QPainterPath::isEmpty();
  if (cVar3 == '\0') {
    local_48.w = -NAN;
    local_48.h = -NAN;
    local_48.xp = -NAN;
    local_48.yp = -NAN;
    (*this->_vptr_QGraphicsItem[3])(&local_48,this);
    if ((local_48.w == 0.0) && (!NAN(local_48.w))) {
      local_48.xp = local_48.xp + -1e-05;
      local_48.yp = local_48.yp + 0.0;
      local_48.w = local_48.w + 2e-05;
      local_48.h = local_48.h + 0.0;
    }
    if ((local_48.h == 0.0) && (!NAN(local_48.h))) {
      local_48.xp = local_48.xp + 0.0;
      local_48.yp = local_48.yp + -1e-05;
      local_48.w = local_48.w + 0.0;
      local_48.h = local_48.h + 2e-05;
    }
    local_70.h = -NAN;
    dStack_50 = -NAN;
    local_70.yp = -NAN;
    local_70.w = -NAN;
    QPainterPath::controlPointRect();
    if ((local_70.h == 0.0) && (!NAN(local_70.h))) {
      local_70.yp = local_70.yp + -1e-05;
      local_70.w = local_70.w + 0.0;
      local_70.h = local_70.h + 2e-05;
      dStack_50 = dStack_50 + 0.0;
    }
    if ((dStack_50 == 0.0) && (!NAN(dStack_50))) {
      local_70.yp = local_70.yp + 0.0;
      local_70.w = local_70.w + -1e-05;
      local_70.h = local_70.h + 0.0;
      dStack_50 = dStack_50 + 2e-05;
    }
    cVar3 = QRectF::intersects(&local_48);
    if (cVar3 != '\0') {
      local_70.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)(local_78 + 8));
      if (mode < ContainsItemBoundingRect) {
        uVar1 = *(ulong *)&((this->d_ptr).d)->field_0x160;
        if ((uVar1 >> 0x1b & 1) == 0 && (uVar1 & 0x800020000) != 0) {
          clipPath((QGraphicsItem *)local_78);
        }
        else {
          (*this->_vptr_QGraphicsItem[4])(local_78,this);
        }
        qVar2 = local_70.xp;
        local_70.xp = (qreal)local_78;
        local_78 = (undefined1  [8])qVar2;
        QPainterPath::~QPainterPath((QPainterPath *)local_78);
      }
      else {
        QPainterPath::addRect((QRectF *)(local_78 + 8));
      }
      QPainterPath::QPainterPath((QPainterPath *)local_78);
      cVar3 = QPainterPath::operator==((QPainterPath *)(local_78 + 8),(QPainterPath *)local_78);
      QPainterPath::~QPainterPath((QPainterPath *)local_78);
      if (cVar3 == '\0') {
        if ((mode & ~ContainsItemBoundingRect) == IntersectsItemShape) {
          uVar4 = QPainterPath::intersects(path);
        }
        else {
          uVar4 = QPainterPath::contains(path);
        }
      }
      else {
        uVar4 = 0;
      }
      QPainterPath::~QPainterPath((QPainterPath *)(local_78 + 8));
      goto LAB_005ecb06;
    }
  }
  uVar4 = 0;
LAB_005ecb06:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)uVar4;
}

Assistant:

bool QGraphicsItem::collidesWithPath(const QPainterPath &path, Qt::ItemSelectionMode mode) const
{
    if (path.isEmpty()) {
        // No collision with empty paths.
        return false;
    }

    QRectF rectA(boundingRect());
    _q_adjustRect(&rectA);
    QRectF rectB(path.controlPointRect());
    _q_adjustRect(&rectB);
    if (!rectA.intersects(rectB)) {
        // This we can determine efficiently. If the two rects neither
        // intersect nor contain each other, then the two items do not collide.
        return false;
    }

    // For further testing, we need this item's shape or bounding rect.
    QPainterPath thisShape;
    if (mode == Qt::IntersectsItemShape || mode == Qt::ContainsItemShape)
        thisShape = (isClipped() && !d_ptr->localCollisionHack) ? clipPath() : shape();
    else
        thisShape.addRect(rectA);

    if (thisShape == QPainterPath()) {
        // Empty shape? No collision.
        return false;
    }

    // Use QPainterPath boolean operations to determine the collision, O(N*logN).
    if (mode == Qt::IntersectsItemShape || mode == Qt::IntersectsItemBoundingRect)
        return path.intersects(thisShape);
    return path.contains(thisShape);
}